

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O1

Expression __thiscall
cnn::SimpleRNNBuilder::add_auxiliary_input(SimpleRNNBuilder *this,Expression *in,Expression *aux)

{
  ComputationGraph *pCVar1;
  undefined8 *puVar2;
  long lVar3;
  ComputationGraph *pCVar4;
  uint uVar5;
  undefined8 *in_RCX;
  long lVar6;
  long lVar7;
  uint uVar8;
  Expression *pEVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x;
  Expression EVar10;
  Expression y;
  ComputationGraph *local_e8;
  uint local_e0;
  initializer_list<cnn::expr::Expression> local_d8;
  Expression *local_c8;
  ulong local_c0;
  VariableIndex *local_b8;
  initializer_list<cnn::expr::Expression> local_b0;
  ComputationGraph local_a0;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  SimpleRNNBuilder *local_50;
  long local_48;
  long local_40;
  undefined8 *local_38;
  
  pCVar4 = in[6].pg;
  lVar6 = *(long *)&in[5].i;
  local_c8 = in;
  local_38 = in_RCX;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_a0,
             (ulong)in[8].i.t,(allocator_type *)&local_e8);
  local_b8 = &in[5].i;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)&in[5].i,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_a0);
  local_50 = this;
  if ((ComputationGraph *)
      local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (ComputationGraph *)0x0) {
    operator_delete(local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_c0 = ((long)pCVar4 - lVar6 >> 3) * -0x5555555555555555;
  if (local_c8[8].i.t != 0) {
    lVar6 = 0;
    lVar7 = 8;
    local_40 = (local_c0 & 0xffffffff) * 3;
    local_48 = (ulong)((int)local_c0 - 1) * 3;
    uVar8 = 0;
    pCVar4 = aux->pg;
    pEVar9 = local_c8;
    uVar5 = (aux->i).t;
    do {
      pCVar1 = pEVar9[4].pg;
      if ((ulong)(*(long *)((long)&(pCVar1->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + lVar6) -
                 *(long *)((long)&(pCVar1->nodes).
                                  super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar6)) < 0x31) {
        __assert_fail("vars.size() >= L2H + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/rnn.cc"
                      ,0x62,
                      "Expression cnn::SimpleRNNBuilder::add_auxiliary_input(const Expression &, const Expression &)"
                     );
      }
      puVar2 = *(undefined8 **)
                ((long)&(pCVar1->nodes).
                        super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar6);
      local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar2[4];
      local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(uint *)(puVar2 + 5);
      local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar2;
      local_a0.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(puVar2 + 1);
      local_a0.ee = (ExecutionEngine *)puVar2[6];
      local_68 = *(undefined4 *)(puVar2 + 7);
      local_60 = *local_38;
      local_58 = *(undefined4 *)(local_38 + 1);
      local_d8._M_len = 5;
      local_d8._M_array = (iterator)&local_a0;
      local_a0.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pCVar4;
      local_a0.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = uVar5;
      expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_e8,&local_d8);
      pEVar9 = local_c8;
      if ((int)local_c0 == 0) {
        pCVar4 = local_c8[7].pg;
        __x = extraout_XMM0_Qa;
        if (*(ComputationGraph **)&local_c8[7].i != pCVar4) {
          local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_e8;
          local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = local_e0;
          lVar3 = *(long *)((long)&(pCVar1->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar6);
          local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar3 + 0x10);
          local_a0.parameter_nodes.
          super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar3 + 0x18);
          local_a0.parameter_nodes.
          super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
          super__Vector_impl_data._M_finish = *(pointer *)((long)pCVar4 + lVar7 + -8);
          local_a0.parameter_nodes.
          super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               *(uint *)((long)&(pCVar4->nodes).
                                super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar7);
          local_b0._M_len = 3;
          local_b0._M_array = (iterator)&local_a0;
          expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&local_d8,&local_b0);
          local_e8 = (ComputationGraph *)local_d8._M_array;
          local_e0 = (uint)local_d8._M_len;
          __x = extraout_XMM0_Qa_01;
        }
      }
      else {
        local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_e8;
        local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = local_e0;
        lVar3 = *(long *)((long)&(pCVar1->nodes).
                                 super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar6);
        local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar3 + 0x10);
        local_a0.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar3 + 0x18);
        lVar3 = *(long *)(*(long *)local_b8 + local_48 * 8);
        local_a0.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = *(pointer *)(lVar3 + -8 + lVar7);
        local_a0.parameter_nodes.
        super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = *(uint *)(lVar3 + lVar7);
        local_b0._M_len = 3;
        local_b0._M_array = (iterator)&local_a0;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_d8,&local_b0);
        local_e8 = (ComputationGraph *)local_d8._M_array;
        local_e0 = (uint)local_d8._M_len;
        pEVar9 = local_c8;
        __x = extraout_XMM0_Qa_00;
      }
      expr::tanh((expr *)&local_a0,__x);
      lVar3 = *(long *)(*(long *)&pEVar9[5].i + local_40 * 8);
      *(pointer *)(lVar3 + -8 + lVar7) =
           local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(uint *)(lVar3 + lVar7) =
           (uint)local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x10;
      lVar6 = lVar6 + 0x18;
      pCVar4 = (ComputationGraph *)
               local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (uint)local_a0.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar8 < pEVar9[8].i.t);
  }
  lVar6 = *(long *)(*(long *)local_b8 + 8 + (local_c0 & 0xffffffff) * 0x18);
  (local_50->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar6 + -0x10);
  (local_50->super_RNNBuilder).cur.t = *(int *)(lVar6 + -8);
  EVar10._8_8_ = lVar6;
  EVar10.pg = (ComputationGraph *)local_50;
  return EVar10;
}

Assistant:

Expression SimpleRNNBuilder::add_auxiliary_input(const Expression &in, const Expression &aux) {
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));

  Expression x = in;

  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    assert(vars.size() >= L2H + 1);

    Expression y = affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux});

    if (t == 0 && h0.size() > 0)
      y = affine_transform({y, vars[H2H], h0[i]});
    else if (t >= 1)
      y = affine_transform({y, vars[H2H], h[t-1][i]});

    x = h[t][i] = tanh(y);
  }
  return h[t].back();
}